

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (Result<CBlockIndex_*> *__return_storage_ptr__,ChainstateManager *this,
          AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  CChainParams *this_00;
  CTxMemPool *this_01;
  size_t sVar5;
  pointer ppCVar6;
  string original;
  optional<uint256> from_snapshot_blockhash;
  path leveldb_name;
  undefined1 auVar7 [8];
  pointer piVar8;
  undefined8 uVar9;
  bool bVar10;
  AssumeutxoData *el;
  pointer pAVar11;
  CBlockIndex *pCVar12;
  CBlockIndex *pCVar13;
  unsigned_long uVar14;
  Chainstate *pCVar15;
  __uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true> this_02;
  CCoinsViewCache *this_03;
  size_t sVar16;
  pointer args;
  ulong uVar17;
  CBlockIndex *pb;
  undefined1 *puVar18;
  _Head_base<0UL,_CoinsViews_*,_false> _Var19;
  ulong uVar20;
  _Base_ptr p_Var21;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ChainstateManager *pCVar22;
  long in_FS_OFFSET;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  __single_object snapshot_chainstate;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  string heights_formatted;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  uint256 base_blockhash;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 uVar28;
  undefined8 in_stack_fffffffffffffa00;
  char *fmt;
  undefined8 in_stack_fffffffffffffa08;
  string *args_00;
  undefined8 in_stack_fffffffffffffa10;
  _Base_ptr p_Var29;
  string sVar30;
  undefined7 in_stack_fffffffffffffa19;
  undefined1 local_598 [8];
  vector<int,_std::allocator<int>_> local_590;
  unique_lock<std::recursive_mutex> local_578;
  _Base_ptr local_568;
  long local_560;
  _Base_ptr local_558 [2];
  undefined1 local_548 [32];
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  undefined1 local_508 [64];
  _Base_ptr local_4c8;
  _Base_ptr local_4c0;
  _Base_ptr local_4b8 [2];
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Error local_468;
  undefined1 local_428 [64];
  _Base_ptr *local_3e8;
  long local_3e0;
  _Base_ptr local_3d8 [2];
  undefined1 local_3c8 [8];
  bool local_3c0;
  undefined7 uStack_3bf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined1 local_388 [64];
  Error local_348;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  string local_2e8 [16];
  undefined1 local_2d8 [64];
  ChainstateManager *local_298 [2];
  undefined1 local_288 [24];
  CBlockIndex *local_270;
  __native_type local_268;
  _Base_ptr p_Stack_240;
  ChainstateManager *local_238;
  size_t local_230;
  undefined1 local_228 [16];
  Chainstate *local_218;
  CBlockIndex *local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [8];
  CTxMemPool *pCStack_1e0;
  _Head_base<0UL,_CoinsViews_*,_false> local_1d8;
  size_t local_1d0;
  _Head_base<0UL,_Chainstate_*,_false> local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Head_base<0UL,_CoinsViews_*,_false> local_178;
  size_t local_170;
  _Head_base<0UL,_Chainstate_*,_false> local_168;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  _Base_ptr local_108 [2];
  bilingual_str local_f8;
  _Base_ptr local_b8;
  size_t local_b0;
  _Base_ptr local_a8 [2];
  _Base_ptr local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  _Base_ptr local_78;
  _Base_ptr local_70;
  undefined1 local_68 [17];
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  _Base_ptr local_38;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,in_memory);
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  unique0x10000e1a =
       *(_Base_ptr *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  uStack_50 = *(ulong *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  local_48 = *(_Base_ptr *)
              ((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_40 = *(_Base_ptr *)
               ((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  SnapshotBlockhash((optional<uint256> *)local_308,this);
  if (local_2e8[0] == (string)0x1) {
    local_b8 = (_Base_ptr)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Can\'t activate a snapshot-based chainstate more than once","");
    local_98 = (_Base_ptr)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8,(long)&local_b8->_M_color + local_b0);
    local_78 = (_Base_ptr)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8,(long)&local_b8->_M_color + local_b0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if (local_98 == (_Base_ptr)local_88) {
      *puVar1 = CONCAT71(local_88._1_7_,local_88[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_88._8_8_;
    }
    else {
      *(_Base_ptr *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_88._1_7_,local_88[0]);
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_90;
    local_90 = (_Base_ptr)0x0;
    local_88[0] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_78 == (_Base_ptr)local_68) {
      *puVar1 = CONCAT71(local_68._1_7_,local_68[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_68._8_8_;
    }
    else {
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_68._1_7_,local_68[0]);
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_70;
    local_70 = (_Base_ptr)0x0;
    local_68[0] = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_98 = (_Base_ptr)local_88;
    local_78 = (_Base_ptr)local_68;
    if (local_b8 != (_Base_ptr)local_a8) {
      operator_delete(local_b8,(ulong)((long)&local_a8[0]->_M_color + 1));
    }
    goto LAB_00416967;
  }
  local_578._M_device = &cs_main.super_recursive_mutex;
  local_578._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_578);
  this_00 = (this->m_options).chainparams;
  args = (this_00->m_assumeutxo_data).
         super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
         super__Vector_impl_data._M_finish;
  for (pAVar11 = (this_00->m_assumeutxo_data).
                 super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                 super__Vector_impl_data._M_start; pAVar11 != args; pAVar11 = pAVar11 + 1) {
    auVar26[0] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                  (uchar)local_48);
    auVar26[1] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                  local_48._1_1_);
    auVar26[2] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                  local_48._2_1_);
    auVar26[3] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                  local_48._3_1_);
    auVar26[4] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                  local_48._4_1_);
    auVar26[5] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                  local_48._5_1_);
    auVar26[6] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                  local_48._6_1_);
    auVar26[7] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                  local_48._7_1_);
    auVar26[8] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                  (undefined1)uStack_40);
    auVar26[9] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                  uStack_40._1_1_);
    auVar26[10] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   uStack_40._2_1_);
    auVar26[0xb] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    uStack_40._3_1_);
    auVar26[0xc] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    uStack_40._4_1_);
    auVar26[0xd] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    uStack_40._5_1_);
    auVar26[0xe] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    uStack_40._6_1_);
    auVar26[0xf] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    uStack_40._7_1_);
    auVar24[0] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0] == local_68[0x10]);
    auVar24[1] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[1] == uStack_57);
    auVar24[2] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[2] == uStack_56);
    auVar24[3] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[3] == uStack_55);
    auVar24[4] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[4] == uStack_54);
    auVar24[5] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[5] == uStack_53);
    auVar24[6] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[6] == uStack_52);
    auVar24[7] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[7] == uStack_51);
    auVar24[8] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[8] ==
                  (undefined1)uStack_50);
    auVar24[9] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[9] == uStack_50._1_1_)
    ;
    auVar24[10] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[10] ==
                   uStack_50._2_1_);
    auVar24[0xb] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                    uStack_50._3_1_);
    auVar24[0xc] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                    uStack_50._4_1_);
    auVar24[0xd] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                    uStack_50._5_1_);
    auVar24[0xe] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                    uStack_50._6_1_);
    auVar24[0xf] = -((pAVar11->blockhash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                    uStack_50._7_1_);
    auVar24 = auVar24 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
      pCVar12 = ::node::BlockManager::LookupBlockIndex
                          (&this->m_blockman,(uint256 *)(local_68 + 0x10));
      if (pCVar12 == (CBlockIndex *)0x0) {
        local_178._M_head_impl = (CoinsViews *)&local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,
                   "The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"
                   ,"");
        local_308._0_8_ = (RecursiveMutex *)(local_308 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,local_178._M_head_impl,
                   local_170 + (long)local_178._M_head_impl);
        local_2e8._0_8_ = (_Base_ptr)local_2d8;
        std::__cxx11::string::_M_construct<char*>
                  (local_2e8,local_178._M_head_impl,local_170 + (long)local_178._M_head_impl);
        base_blob<256u>::ToString_abi_cxx11_((string *)local_3c8,local_68 + 0x10);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_158,(tinyformat *)local_308,(bilingual_str *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        pCVar22 = (ChainstateManager *)(local_158 + 0x10);
        if ((ChainstateManager *)local_158._0_8_ == pCVar22) {
          *puVar1 = CONCAT71(local_158._17_7_,local_158[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
               local_158._24_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_158._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_158._17_7_,local_158[0x10]);
        }
        puVar18 = local_138 + 0x10;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_158._8_8_;
        local_158._8_8_ = (_Base_ptr)0x0;
        local_158[0x10] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((undefined1 *)local_138._0_8_ == puVar18) {
          *puVar1 = CONCAT71(local_138._17_7_,local_138[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_138._24_8_;
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_138._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_138._17_7_,local_138[0x10]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_138._8_8_;
        local_138._8_8_ = 0;
        local_138[0x10] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_158._0_8_ = pCVar22;
        local_138._0_8_ = puVar18;
        if (local_3c8 != (undefined1  [8])&local_3b8) {
          operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
        }
        if ((_Base_ptr)local_2e8._0_8_ != (_Base_ptr)local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        if ((RecursiveMutex *)local_308._0_8_ != (RecursiveMutex *)(local_308 + 0x10)) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
        }
        _Var19._M_head_impl = local_178._M_head_impl;
        if (local_178._M_head_impl == (CoinsViews *)&local_168) goto LAB_0041695a;
      }
      else if ((pCVar12->nStatus & 0x60) == 0) {
        if ((this->m_best_header == (CBlockIndex *)0x0) ||
           (pCVar13 = CBlockIndex::GetAncestor(this->m_best_header,pCVar12->nHeight),
           pCVar13 != pCVar12)) {
          local_238 = (ChainstateManager *)local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo."
                     ,"");
          local_218 = (Chainstate *)local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_238,
                     (long)((local_238->m_warningcache)._M_elems + -1) + local_230);
          local_208._16_8_ = local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_208 + 0x10),local_238,
                     (long)((local_238->m_warningcache)._M_elems + -1) + local_230);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
          if (local_218 == (Chainstate *)local_208) {
            *puVar1 = CONCAT71(local_208._1_7_,local_208[0]);
            ((duration *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
                 local_208._8_8_;
          }
          else {
            *(Chainstate **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_218;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
                 CONCAT71(local_208._1_7_,local_208[0]);
          }
          *(CBlockIndex **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_210;
          local_210 = (CBlockIndex *)0x0;
          local_208[0] = '\0';
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
          if ((undefined1 *)local_208._16_8_ == local_1e8) {
            *puVar1 = CONCAT71(local_1e8._1_7_,local_1e8[0]);
            *(CTxMemPool **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                 pCStack_1e0;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                 local_208._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
                 CONCAT71(local_1e8._1_7_,local_1e8[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
               local_208._24_8_;
          local_208._24_8_ = (__pthread_internal_list *)0x0;
          local_1e8[0] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
          local_168._M_head_impl = (Chainstate *)local_228._0_8_;
          _Var19._M_head_impl = (CoinsViews *)local_238;
          local_218 = (Chainstate *)local_208;
          local_208._16_8_ = local_1e8;
          if (local_238 == (ChainstateManager *)local_228) goto LAB_0041695a;
        }
        else {
          this_01 = this->m_active_chainstate->m_mempool;
          if ((this_01 == (CTxMemPool *)0x0) || (uVar14 = CTxMemPool::size(this_01), uVar14 == 0)) {
            std::unique_lock<std::recursive_mutex>::~unique_lock(&local_578);
            local_308._0_8_ = &cs_main;
            local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)local_308);
            pCVar15 = ActiveChainstate(this);
            sVar16 = pCVar15->m_coinsdb_cache_size_bytes;
            pCVar15 = ActiveChainstate(this);
            sVar5 = pCVar15->m_coinstip_cache_size_bytes;
            pCVar15 = ActiveChainstate(this);
            dVar25 = (double)(long)sVar5 * 0.01;
            uVar17 = (ulong)dVar25;
            dVar23 = (double)(long)sVar16 * 0.01;
            uVar20 = (ulong)dVar23;
            Chainstate::ResizeCoinsCaches
                      (pCVar15,(long)(dVar25 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f |
                               uVar17,
                       (long)(dVar23 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)local_308);
            local_3c8 = (undefined1  [8])&cs_main;
            local_3c0 = false;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)local_3c8);
            this_02.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)operator_new(0xe8);
            local_2f8._0_8_ = local_48;
            local_2f8._8_8_ = uStack_40;
            local_308._0_8_ = stack0xffffffffffffffa8;
            local_308._8_8_ = uStack_50;
            local_2e8[0] = (string)0x1;
            uVar9 = local_2e8._0_8_;
            local_2e8[0] = (string)0x1;
            uVar27 = SUB84(stack0xffffffffffffffa8,0);
            uVar28 = (undefined4)((ulong)stack0xffffffffffffffa8 >> 0x20);
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._8_8_ = uStack_50;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._0_8_ = stack0xffffffffffffffa8;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._16_8_ = local_48;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._24_8_ = uStack_40;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged = true;
            uVar17 = uStack_50;
            p_Var21 = local_48;
            p_Var29 = uStack_40;
            sVar30 = local_2e8[0];
            local_2e8._0_8_ = uVar9;
            Chainstate::Chainstate
                      ((Chainstate *)
                       this_02.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                       _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,(CTxMemPool *)0x0,
                       &this->m_blockman,this,from_snapshot_blockhash);
            local_598 = (undefined1  [8])
                        this_02.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                        _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)local_3c8);
            local_308._0_8_ = &cs_main;
            local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)local_308);
            auVar7 = local_598;
            local_3c8 = (undefined1  [8])0x83a880;
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      ((path *)(local_2d8 + 0x18),(char **)local_3c8,auto_format);
            dVar23 = (double)(long)sVar16 * 0.99;
            uVar20 = (ulong)dVar23;
            leveldb_name.super_path._M_pathname._M_dataplus._M_p._4_4_ = uVar28;
            leveldb_name.super_path._M_pathname._M_dataplus._M_p._0_4_ = uVar27;
            leveldb_name.super_path._M_pathname._M_string_length = uVar17;
            leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)p_Var21;
            leveldb_name.super_path._M_pathname.field_2._8_8_ = p_Var29;
            leveldb_name.super_path._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._0_1_ = sVar30;
            leveldb_name.super_path._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._1_7_ = in_stack_fffffffffffffa19;
            Chainstate::InitCoinsDB
                      ((Chainstate *)auVar7,
                       (long)(dVar23 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20,
                       in_memory,false,leveldb_name);
            std::filesystem::__cxx11::path::~path((path *)(local_2d8 + 0x18));
            dVar23 = (double)(long)sVar5 * 0.99;
            uVar17 = (ulong)dVar23;
            Chainstate::InitCoinsCache
                      ((Chainstate *)local_598,
                       (long)(dVar23 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)local_308);
            local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)local_598;
            local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            PopulateAndValidateSnapshot
                      ((Result<void> *)local_308,this,(Chainstate *)local_598,coins_file,metadata);
            if (local_2d8[0x10] == '\x01') {
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_308)
              ;
              local_3c8 = (undefined1  [8])&cs_main;
              local_3c0 = false;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)local_3c8);
              pCVar15 = ActiveChainstate(this);
              ppCVar6 = (pCVar15->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppCVar6 ==
                  (pCVar15->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pCVar13 = (CBlockIndex *)0x0;
              }
              else {
                pCVar13 = ppCVar6[-1];
              }
              if (*(pointer *)((long)local_598 + 0x60) ==
                  (((CChain *)((long)local_598 + 0x58))->vChain).
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pb = (CBlockIndex *)0x0;
              }
              else {
                pb = (*(pointer *)((long)local_598 + 0x60))[-1];
              }
              bVar10 = ::node::CBlockIndexWorkComparator::operator()
                                 ((CBlockIndexWorkComparator *)local_308,pCVar13,pb);
              if (bVar10) {
                if ((in_memory) ||
                   (bVar10 = ::node::WriteSnapshotBaseBlockhash((Chainstate *)local_598), bVar10)) {
                  auVar7 = local_598;
                  if ((this->m_snapshot_chainstate)._M_t.
                      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)
                  {
                    __assert_fail("!m_snapshot_chainstate",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x169f,
                                  "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                                 );
                  }
                  (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)local_598;
                  local_598 = (undefined1  [8])0x0;
                  bVar10 = Chainstate::LoadChainTip((Chainstate *)auVar7);
                  if (!bVar10) {
                    __assert_fail("chaintip_loaded",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x16a2,
                                  "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                                 );
                  }
                  uVar14 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
                  local_308[0] = uVar14 == 0;
                  inline_assertion_check<true,bool>
                            ((bool *)local_308,
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                             ,0x16a6,"ActivateSnapshot",
                             "m_active_chainstate->m_mempool->size() == 0");
                  local_308[0] = ((this->m_snapshot_chainstate)._M_t.
                                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                  .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                                 m_mempool == (CTxMemPool *)0x0;
                  inline_assertion_check<true,bool>
                            ((bool *)local_308,
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                             ,0x16a7,"ActivateSnapshot","!m_snapshot_chainstate->m_mempool");
                  pCVar15 = this->m_active_chainstate;
                  ((this->m_snapshot_chainstate)._M_t.
                   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool =
                       pCVar15->m_mempool;
                  pCVar15->m_mempool = (CTxMemPool *)0x0;
                  pCVar15 = (this->m_snapshot_chainstate)._M_t.
                            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t
                            .super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
                  this->m_active_chainstate = pCVar15;
                  if ((pCVar15 == (Chainstate *)0x0) ||
                     (pCVar13 = Chainstate::SnapshotBase(pCVar15), pCVar13 == (CBlockIndex *)0x0)) {
                    uVar17 = 0;
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = (ulong)(uint)pCVar13->nHeight;
                    uVar17 = 0x100000000;
                  }
                  (this->m_blockman).m_snapshot_height.super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int> =
                       (_Optional_payload_base<int>)(uVar17 | uVar20);
                  base_blob<256u>::ToString_abi_cxx11_((string *)local_308,local_68 + 0x10);
                  fmt = "[snapshot] successfully activated snapshot %s\n";
                  logging_function._M_str = "ActivateSnapshot";
                  logging_function._M_len = 0x10;
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ;
                  source_file._M_len = 0x57;
                  args_00 = (string *)local_308;
                  ::LogPrintf_<std::__cxx11::string>
                            (logging_function,source_file,0x16ad,ALL,Info,
                             "[snapshot] successfully activated snapshot %s\n",(string *)local_308);
                  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
                  }
                  this_03 = Chainstate::CoinsTip
                                      ((this->m_snapshot_chainstate)._M_t.
                                       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                       .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
                  sVar16 = CCoinsViewCache::DynamicMemoryUsage(this_03);
                  local_308._0_8_ = sVar16 / 1000000;
                  logging_function_00._M_str = "ActivateSnapshot";
                  logging_function_00._M_len = 0x10;
                  source_file_00._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ;
                  source_file_00._M_len = 0x57;
                  LogPrintf_<unsigned_long>
                            (logging_function_00,source_file_00,0x16af,
                             IPC|LIBEVENT|MEMPOOLREJ|PROXY|RAND|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|
                             WALLETDB|HTTP|MEMPOOL,(Level)(string *)local_308,fmt,
                             (unsigned_long *)args_00);
                  MaybeRebalanceCaches(this);
                  *(CBlockIndex **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = pCVar12;
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) =
                       '\x01';
                }
                else {
                  local_568 = (_Base_ptr)local_558;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_568,"could not write base blockhash","");
                  local_548._0_8_ = (_Base_ptr)(local_548 + 0x10);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_548,local_568,(long)&local_568->_M_color + local_560);
                  local_528._M_p = (pointer)&local_518;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_528,local_568,(long)&local_568->_M_color + local_560);
                  ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                            ((Error *)local_508,(anon_class_16_2_a94f38f8 *)&local_590,
                             (bilingual_str *)local_548);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10
                           );
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
                  pcVar4 = local_508 + 0x10;
                  if ((pointer)local_508._0_8_ == pcVar4) {
                    *puVar1 = CONCAT71(local_508._17_7_,local_508[0x10]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                         local_508._24_8_;
                  }
                  else {
                    *(undefined8 *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_508._0_8_;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                              0x10) = CONCAT71(local_508._17_7_,local_508[0x10]);
                  }
                  p_Var21 = (_Base_ptr)(local_508 + 0x30);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                       local_508._8_8_;
                  local_508._8_8_ = 0;
                  local_508[0x10] = '\0';
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30
                           );
                  *(undefined8 **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                       puVar1;
                  if ((_Base_ptr)local_508._32_8_ == p_Var21) {
                    *puVar1 = CONCAT71(local_508._49_7_,local_508[0x30]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                         local_508._56_8_;
                  }
                  else {
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                         local_508._32_8_;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                              0x30) = CONCAT71(local_508._49_7_,local_508[0x30]);
                  }
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                       local_508._40_8_;
                  local_508._40_8_ = 0;
                  local_508[0x30] = '\0';
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0'
                  ;
                  local_508._0_8_ = pcVar4;
                  local_508._32_8_ = p_Var21;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_p != &local_518) {
                    operator_delete(local_528._M_p,(ulong)(local_518._M_allocated_capacity + 1));
                  }
                  if ((_Base_ptr)local_548._0_8_ != (_Base_ptr)(local_548 + 0x10)) {
                    operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
                  }
                  local_4b8[0] = local_558[0];
                  p_Var21 = local_568;
                  if (local_568 != (_Base_ptr)local_558) goto LAB_004173b0;
                }
              }
              else {
                local_4c8 = (_Base_ptr)local_4b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4c8,"work does not exceed active chainstate","");
                local_4a8._0_8_ = (_Base_ptr)(local_4a8 + 0x10);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_4a8,local_4c8,
                           (long)&local_4c8->_M_color + (long)&local_4c0->_M_color);
                local_488._M_p = (pointer)&local_478;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_488,local_4c8,
                           (long)&local_4c8->_M_color + (long)&local_4c0->_M_color);
                ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                          (&local_468,(anon_class_16_2_a94f38f8 *)&local_590,
                           (bilingual_str *)local_4a8);
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
                *(undefined8 **)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
                paVar2 = &local_468.message.original.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468.message.original._M_dataplus._M_p == paVar2) {
                  *puVar1 = CONCAT71(local_468.message.original.field_2._M_allocated_capacity._1_7_,
                                     local_468.message.original.field_2._M_local_buf[0]);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                       local_468.message.original.field_2._8_8_;
                }
                else {
                  *(pointer *)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
                       local_468.message.original._M_dataplus._M_p;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                            0x10) =
                       CONCAT71(local_468.message.original.field_2._M_allocated_capacity._1_7_,
                                local_468.message.original.field_2._M_local_buf[0]);
                }
                paVar3 = &local_468.message.translated.field_2;
                *(size_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                     local_468.message.original._M_string_length;
                local_468.message.original._M_string_length = 0;
                local_468.message.original.field_2._M_local_buf[0] = '\0';
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
                *(undefined8 **)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468.message.translated._M_dataplus._M_p == paVar3) {
                  *puVar1 = CONCAT71(local_468.message.translated.field_2._M_allocated_capacity.
                                     _1_7_,local_468.message.translated.field_2._M_local_buf[0]);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                       local_468.message.translated.field_2._8_8_;
                }
                else {
                  *(pointer *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                       local_468.message.translated._M_dataplus._M_p;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                            0x30) =
                       CONCAT71(local_468.message.translated.field_2._M_allocated_capacity._1_7_,
                                local_468.message.translated.field_2._M_local_buf[0]);
                }
                *(size_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                     local_468.message.translated._M_string_length;
                local_468.message.translated._M_string_length = 0;
                local_468.message.translated.field_2._M_local_buf[0] = '\0';
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
                local_468.message.original._M_dataplus._M_p = (pointer)paVar2;
                local_468.message.translated._M_dataplus._M_p = (pointer)paVar3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_p != &local_478) {
                  operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
                }
                if ((_Base_ptr)local_4a8._0_8_ != (_Base_ptr)(local_4a8 + 0x10)) {
                  operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
                }
                p_Var21 = local_4c8;
                if (local_4c8 != (_Base_ptr)local_4b8) {
LAB_004173b0:
                  operator_delete(p_Var21,(ulong)((long)&local_4b8[0]->_M_color + 1));
                }
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)local_3c8);
            }
            else {
              local_578._M_device = &cs_main.super_recursive_mutex;
              local_578._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&local_578);
              local_3e8 = local_3d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3e8,"Population failed: %s","");
              local_3c8 = (undefined1  [8])&local_3b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3c8,local_3e8,(long)local_3e8 + local_3e0);
              local_3a8._M_p = (pointer)&local_398;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a8,local_3e8,(long)local_3e8 + local_3e0);
              util::ErrorString<void>((bilingual_str *)local_428,(Result<void> *)local_308);
              tinyformat::format<bilingual_str>
                        ((bilingual_str *)local_388,(bilingual_str *)local_3c8,
                         (bilingual_str *)local_428);
              ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                        (&local_348,(anon_class_16_2_a94f38f8 *)&local_590,
                         (bilingual_str *)local_388);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_CBlockIndex_*>.
                               super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_CBlockIndex_*>.
                super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
              paVar2 = &local_348.message.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.message.original._M_dataplus._M_p == paVar2) {
                *puVar1 = CONCAT71(local_348.message.original.field_2._M_allocated_capacity._1_7_,
                                   local_348.message.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                     local_348.message.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
                     local_348.message.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10)
                     = CONCAT71(local_348.message.original.field_2._M_allocated_capacity._1_7_,
                                local_348.message.original.field_2._M_local_buf[0]);
              }
              paVar3 = &local_348.message.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                   local_348.message.original._M_string_length;
              local_348.message.original._M_string_length = 0;
              local_348.message.original.field_2._M_local_buf[0] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_CBlockIndex_*>.
                               super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.message.translated._M_dataplus._M_p == paVar3) {
                *puVar1 = CONCAT71(local_348.message.translated.field_2._M_allocated_capacity._1_7_,
                                   local_348.message.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                     local_348.message.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                     local_348.message.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30)
                     = CONCAT71(local_348.message.translated.field_2._M_allocated_capacity._1_7_,
                                local_348.message.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                   local_348.message.translated._M_string_length;
              local_348.message.translated._M_string_length = 0;
              local_348.message.translated.field_2._M_local_buf[0] = '\0';
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
              local_348.message.original._M_dataplus._M_p = (pointer)paVar2;
              local_348.message.translated._M_dataplus._M_p = (pointer)paVar3;
              if ((_Base_ptr)local_388._32_8_ != (_Base_ptr)(local_388 + 0x30)) {
                operator_delete((void *)local_388._32_8_,local_388._48_8_ + 1);
              }
              if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
              }
              if ((_Base_ptr)local_428._32_8_ != (_Base_ptr)(local_428 + 0x30)) {
                operator_delete((void *)local_428._32_8_,(ulong)(local_428._48_8_ + 1));
              }
              if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
                operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_p != &local_398) {
                operator_delete(local_3a8._M_p,local_398._M_allocated_capacity + 1);
              }
              if (local_3c8 != (undefined1  [8])&local_3b8) {
                operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
              }
              if (local_3e8 != local_3d8) {
                operator_delete(local_3e8,(ulong)((long)&local_3d8[0]->_M_color + 1));
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_578);
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_308)
              ;
            }
            if ((_Head_base<0UL,_Chainstate_*,_false>)local_598 !=
                (_Head_base<0UL,_Chainstate_*,_false>)0x0) {
              std::default_delete<Chainstate>::operator()
                        ((default_delete<Chainstate> *)local_598,(Chainstate *)local_598);
            }
            goto LAB_00416967;
          }
          local_298[0] = (ChainstateManager *)local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Can\'t activate a snapshot when mempool not empty","");
          original._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9fc;
          original._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9f8;
          original._M_string_length = in_stack_fffffffffffffa00;
          original.field_2._M_allocated_capacity = in_stack_fffffffffffffa08;
          original.field_2._8_8_ = in_stack_fffffffffffffa10;
          Untranslated((bilingual_str *)(local_288 + 0x10),original);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
          if ((__native_type *)local_288._16_8_ == &local_268) {
            *puVar1 = CONCAT71(local_268.__align._1_7_,local_268.__size[0]);
            ((duration *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
                 local_268._8_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_288._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
                 CONCAT71(local_268.__align._1_7_,local_268.__size[0]);
          }
          *(CBlockIndex **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_270;
          local_270 = (CBlockIndex *)0x0;
          local_268.__size[0] = '\0';
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
          if ((char *)local_268._16_8_ == local_268.__size + 0x20) {
            *puVar1 = CONCAT71(local_268._33_7_,local_268.__size[0x20]);
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                 p_Stack_240;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                 local_268._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
                 CONCAT71(local_268._33_7_,local_268.__size[0x20]);
          }
          *(__pthread_internal_list **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
               local_268.__data.__list.__prev;
          local_268.__data.__list.__prev = (__pthread_internal_list *)0x0;
          local_268.__size[0x20] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
          local_288._16_8_ = &local_268;
          local_268._16_8_ = local_268.__size + 0x20;
          util::Error::~Error((Error *)(local_288 + 0x10));
          local_168._M_head_impl = (Chainstate *)local_288._0_8_;
          _Var19._M_head_impl = (CoinsViews *)local_298[0];
          if (local_298[0] == (ChainstateManager *)local_288) goto LAB_0041695a;
        }
      }
      else {
        local_1d8._M_head_impl = (CoinsViews *)&local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"The base block header (%s) is part of an invalid chain","")
        ;
        local_308._0_8_ = (RecursiveMutex *)(local_308 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,local_1d8._M_head_impl,
                   local_1d0 + (long)local_1d8._M_head_impl);
        local_2e8._0_8_ = (_Base_ptr)local_2d8;
        std::__cxx11::string::_M_construct<char*>
                  (local_2e8,local_1d8._M_head_impl,local_1d0 + (long)local_1d8._M_head_impl);
        base_blob<256u>::ToString_abi_cxx11_((string *)local_3c8,local_68 + 0x10);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_1b8,(tinyformat *)local_308,(bilingual_str *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        if ((Chainstate *)local_1b8._0_8_ == (Chainstate *)local_1a8) {
          *puVar1 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
          ((duration *)
          ((long)&(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
               local_1a8._8_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_1b8._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_1a8._1_7_,local_1a8[0]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_1b8._8_8_;
        local_1b8._8_8_ = (CBlockIndex *)0x0;
        local_1a8[0] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._16_8_ == &local_188) {
          *puVar1 = CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_188._8_8_;
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_1a8._16_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_1a8._24_8_;
        local_1a8._24_8_ = (__pthread_internal_list *)0x0;
        local_188._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_1b8._0_8_ = (Chainstate *)local_1a8;
        local_1a8._16_8_ = &local_188;
        if (local_3c8 != (undefined1  [8])&local_3b8) {
          operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
        }
        if ((_Base_ptr)local_2e8._0_8_ != (_Base_ptr)local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        if ((RecursiveMutex *)local_308._0_8_ != (RecursiveMutex *)(local_308 + 0x10)) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
        }
        local_168._M_head_impl = local_1c8._M_head_impl;
        _Var19._M_head_impl = local_1d8._M_head_impl;
        if (local_1d8._M_head_impl == (CoinsViews *)&local_1c8) goto LAB_0041695a;
      }
      puVar18 = (undefined1 *)((long)local_168._M_head_impl + 1);
      goto LAB_00416955;
    }
  }
  CChainParams::GetAvailableSnapshotHeights(&local_590,this_00);
  piVar8 = local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_308._0_8_ = local_308 + 0x10;
  local_308._8_8_ = 0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  if (local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_004162d1:
    local_428._0_8_ = local_428 + 0x10;
    local_428._24_8_ = local_2f8._8_8_;
  }
  else {
    bVar10 = true;
    pCVar22 = (ChainstateManager *)
              local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (!bVar10) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   ", ");
      }
      util::ToString<int>((string *)local_3c8,(int *)pCVar22);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                 (char *)local_3c8,CONCAT71(uStack_3bf,local_3c0));
      if (local_3c8 != (undefined1  [8])&local_3b8) {
        operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
      }
      pCVar22 = (ChainstateManager *)
                ((long)&(pCVar22->m_ibd_chainstate)._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 4);
      bVar10 = false;
    } while (pCVar22 != (ChainstateManager *)piVar8);
    if ((undefined1 *)local_308._0_8_ == local_308 + 0x10) goto LAB_004162d1;
    local_428._0_8_ = local_308._0_8_;
  }
  local_428._8_8_ = local_308._8_8_;
  local_428._16_8_ = local_2f8._0_8_;
  local_118 = (_Base_ptr)local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"
             ,"");
  local_308._0_8_ = (RecursiveMutex *)(local_308 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,local_118,(long)&local_118->_M_color + local_110);
  local_2e8._0_8_ = (_Base_ptr)local_2d8;
  std::__cxx11::string::_M_construct<char*>
            (local_2e8,local_118,(long)&local_118->_M_color + local_110);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_3c8,local_68 + 0x10);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_f8,(tinyformat *)local_308,(bilingual_str *)local_3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,args_1);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
  paVar2 = &local_f8.original.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.original._M_dataplus._M_p == paVar2) {
    *puVar1 = CONCAT71(local_f8.original.field_2._M_allocated_capacity._1_7_,
                       local_f8.original.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
         local_f8.original.field_2._8_8_;
  }
  else {
    *(pointer *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
         local_f8.original._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
         CONCAT71(local_f8.original.field_2._M_allocated_capacity._1_7_,
                  local_f8.original.field_2._M_local_buf[0]);
  }
  paVar3 = &local_f8.translated.field_2;
  *(size_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
       local_f8.original._M_string_length;
  local_f8.original._M_string_length = 0;
  local_f8.original.field_2._M_local_buf[0] = '\0';
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
  *(undefined8 **)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.translated._M_dataplus._M_p == paVar3) {
    *puVar1 = CONCAT71(local_f8.translated.field_2._M_allocated_capacity._1_7_,
                       local_f8.translated.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
         local_f8.translated.field_2._8_8_;
  }
  else {
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
         local_f8.translated._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
         CONCAT71(local_f8.translated.field_2._M_allocated_capacity._1_7_,
                  local_f8.translated.field_2._M_local_buf[0]);
  }
  ((duration *)
  ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28))->__r =
       local_f8.translated._M_string_length;
  local_f8.translated._M_string_length = 0;
  local_f8.translated.field_2._M_local_buf[0] = '\0';
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
  local_f8.original._M_dataplus._M_p = (pointer)paVar2;
  local_f8.translated._M_dataplus._M_p = (pointer)paVar3;
  if (local_3c8 != (undefined1  [8])&local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_2e8._0_8_ != (_Base_ptr)local_2d8) {
    operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
  }
  if ((RecursiveMutex *)local_308._0_8_ != (RecursiveMutex *)(local_308 + 0x10)) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
  }
  if (local_118 != (_Base_ptr)local_108) {
    operator_delete(local_118,(ulong)((long)&local_108[0]->_M_color + 1));
  }
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
  }
  if ((ChainstateManager *)
      local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (ChainstateManager *)0x0) {
    puVar18 = (undefined1 *)
              ((long)local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
              (long)local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    _Var19._M_head_impl =
         (CoinsViews *)
         local_590.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
LAB_00416955:
    operator_delete(_Var19._M_head_impl,(ulong)puVar18);
  }
LAB_0041695a:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_578);
LAB_00416967:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }